

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
KmerCounter::count_spectra
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          KmerCounter *this,string *name,uint16_t maxf,bool unique_in_graph,bool present_in_graph)

{
  pointer puVar1;
  pointer pvVar2;
  long lVar3;
  pointer puVar4;
  pointer puVar5;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar6;
  undefined6 in_register_0000000a;
  long lVar7;
  long lVar8;
  ushort uVar9;
  allocator_type local_31;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,(CONCAT62(in_register_0000000a,maxf) & 0xffffffff) + 1,&local_31
            );
  pvVar6 = get_count_by_name(this,name);
  pvVar2 = (this->counts).
           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pvVar2->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                    _M_impl.super__Vector_impl_data;
  puVar4 = *(pointer *)
            ((long)&(pvVar2->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                    _M_impl.super__Vector_impl_data + 8);
  if (unique_in_graph) {
    lVar7 = (long)puVar4 - lVar3;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 1;
      puVar4 = (pvVar6->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
               .super__Vector_impl_data._M_start;
      puVar5 = (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        if (*(short *)(lVar3 + lVar8 * 2) == 1) {
          uVar9 = puVar4[lVar8];
          if (maxf <= uVar9) {
            uVar9 = maxf;
          }
          puVar1 = puVar5 + uVar9;
          *puVar1 = *puVar1 + 1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
    }
  }
  else {
    lVar7 = (long)puVar4 - lVar3;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 1;
      puVar4 = (pvVar6->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
               .super__Vector_impl_data._M_start;
      puVar5 = (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        if ((!present_in_graph) || (*(short *)(lVar3 + lVar8 * 2) != 0)) {
          uVar9 = puVar4[lVar8];
          if (maxf <= uVar9) {
            uVar9 = maxf;
          }
          puVar1 = puVar5 + uVar9;
          *puVar1 = *puVar1 + 1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> KmerCounter::count_spectra(std::string name, uint16_t maxf, bool unique_in_graph, bool present_in_graph) {
    std::vector<uint64_t> s(maxf+1);
    auto &cv=get_count_by_name(name);
    if (unique_in_graph){
        for (auto i=0;i<counts[0].size();++i){
            if (counts[0][i]==1)
                ++s[(cv[i]>maxf ? maxf : cv[i])];
        }

    } else {
        for (auto i=0;i<counts[0].size();++i){
            if ((not present_in_graph) or counts[0][i]>0)
                ++s[(cv[i]>maxf ? maxf : cv[i])];
        }
    }
    return s;
}